

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O3

base_learner *
ExpReplay::expreplay_setup<(char)109,MULTICLASS::mc_label>(options_i *options,vw *all)

{
  undefined4 uVar1;
  size_t count;
  long lVar2;
  _func_int **pp_Var3;
  int iVar4;
  _func_int ***__dest;
  option_group_definition *this;
  typed_option<unsigned_long> *ptVar5;
  long *__dest_00;
  example *peVar6;
  bool *pbVar7;
  ostream *poVar8;
  base_learner *l;
  single_learner *__src;
  learner<ExpReplay::expreplay,_example> *__dest_01;
  string replay_string;
  string replay_count_string;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_1;
  expreplay *local_3f0;
  undefined4 *local_3d8;
  long local_3d0;
  undefined4 local_3c8;
  undefined3 uStack_3c4;
  undefined1 local_3c1;
  _func_int ***local_3b8;
  _func_int **local_3b0;
  _func_int **local_3a8 [2];
  undefined1 *local_398;
  long local_390;
  undefined1 local_388 [16];
  size_t *local_378;
  long local_370;
  long *local_368;
  long local_360;
  long local_358 [2];
  string local_348;
  _func_int ***local_328;
  _func_int **local_320;
  _func_int **local_318 [2];
  string local_308;
  option_group_definition local_2e8;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  typed_option<unsigned_long> local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_long> local_d0;
  
  local_3d8 = &local_3c8;
  local_3c8 = 0x6c706572;
  uStack_3c4 = 0x5f7961;
  local_3d0 = 7;
  local_3c1 = 0;
  std::__cxx11::string::push_back((char)&local_3d8);
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,local_3d8,local_3d0 + (long)local_3d8);
  std::__cxx11::string::append((char *)&local_398);
  local_3f0 = calloc_or_throw<ExpReplay::expreplay>(1);
  local_3f0->replay_count = 0;
  local_3f0->base = (single_learner *)0x0;
  local_3f0->buf = (example *)0x0;
  local_3f0->filled = (bool *)0x0;
  local_3f0->all = (vw *)0x0;
  local_3f0->N = 0;
  local_2b0._0_8_ = (_func_int **)0x11;
  local_3b8 = local_3a8;
  local_3b8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3b8,(ulong)local_2b0);
  local_3a8[0] = (_func_int **)local_2b0._0_8_;
  *(undefined4 *)local_3b8 = 0x65707845;
  builtin_strncpy((char *)((long)local_3b8 + 4),"rien",4);
  *(undefined4 *)(local_3b8 + 1) = 0x52206563;
  builtin_strncpy((char *)((long)local_3b8 + 0xc),"epla",4);
  *(char *)(local_3b8 + 2) = 'y';
  local_3b0 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_3b8 + local_2b0._0_8_) = '\0';
  local_2e8.m_name._M_dataplus._M_p = (pointer)&local_2e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e8,local_3b8,(char *)(local_2b0._0_8_ + (long)local_3b8));
  local_2e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,local_3d8,local_3d0 + (long)local_3d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_2b0,&local_308,&local_3f0->N);
  local_240 = true;
  local_328 = local_318;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x83;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_210);
  pp_Var3 = local_210.super_base_option._vptr_base_option;
  local_318[0] = local_210.super_base_option._vptr_base_option;
  local_328 = __dest;
  memcpy(__dest,
         "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
         ,0x83);
  local_320 = pp_Var3;
  *(undefined1 *)((long)__dest + (long)pp_Var3) = 0;
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_2b0);
  this = VW::config::option_group_definition::add<unsigned_long>(&local_2e8,&local_d0);
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_348,local_398,local_398 + local_390);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_210,&local_348,&local_3f0->replay_count);
  ptVar5 = VW::config::typed_option<unsigned_long>::default_value(&local_210,1);
  local_368 = local_358;
  local_370 = 0x56;
  local_378 = &local_3f0->replay_count;
  __dest_00 = (long *)std::__cxx11::string::_M_create((ulong *)&local_368,(ulong)&local_370);
  lVar2 = local_370;
  local_358[0] = local_370;
  local_368 = __dest_00;
  memcpy(__dest_00,
         "how many times (in expectation) should each example be played (default: 1 = permuting)",
         0x56);
  local_360 = lVar2;
  *(undefined1 *)((long)__dest_00 + lVar2) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,ptVar5);
  VW::config::option_group_definition::add<unsigned_long>(this,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_210.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d16b8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d16b8;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_2e8);
  iVar4 = (*options->_vptr_options_i[1])(options,&local_3d8);
  if (((char)iVar4 == '\0') || (count = local_3f0->N, count == 0)) {
    __dest_01 = (learner<ExpReplay::expreplay,_example> *)0x0;
  }
  else {
    local_3f0->all = all;
    peVar6 = VW::alloc_examples(1,count);
    local_3f0->buf = peVar6;
    pbVar7 = calloc_or_throw<bool>(local_3f0->N);
    local_3f0->filled = pbVar7;
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"experience replay level=",0x18);
      local_2b0[0] = 0x6d;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_2b0,1)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", buffer=",9);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", replay count=",0xf);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    l = setup_base(options,all);
    __src = LEARNER::as_singleline<char,char>(l);
    local_3f0->base = __src;
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest_01 = calloc_or_throw<LEARNER::learner<ExpReplay::expreplay,example>>(1);
    memcpy(__dest_01,__src,0xe9);
    *(single_learner **)(__dest_01 + 0x20) = __src;
    *(code **)(__dest_01 + 0x50) = LEARNER::recur_sensitivity;
    *(expreplay **)(__dest_01 + 0xb8) = local_3f0;
    *(single_learner **)(__dest_01 + 0xc0) = __src;
    *(code **)(__dest_01 + 200) = LEARNER::noop;
    *(undefined8 *)(__dest_01 + 0xd8) = 1;
    *(undefined8 *)(__dest_01 + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(expreplay **)(__dest_01 + 0x18) = local_3f0;
    *(code **)(__dest_01 + 0x28) = predict_or_learn<true,MULTICLASS::mc_label>;
    *(code **)(__dest_01 + 0x38) = predict_or_learn<true,MULTICLASS::mc_label>;
    *(code **)(__dest_01 + 0x30) = predict_or_learn<false,MULTICLASS::mc_label>;
    *(undefined8 *)(__dest_01 + 0x40) = 0;
    *(undefined4 *)(__dest_01 + 0xd0) = uVar1;
    __dest_01[0xe8] = (learner<ExpReplay::expreplay,_example>)0x0;
    *(expreplay **)(__dest_01 + 0xb8) = local_3f0;
    *(single_learner **)(__dest_01 + 0xc0) = __src;
    *(code **)(__dest_01 + 200) = finish<MULTICLASS::mc_label>;
    *(expreplay **)(__dest_01 + 0x88) = local_3f0;
    *(single_learner **)(__dest_01 + 0x90) = __src;
    *(code **)(__dest_01 + 0x98) = end_pass;
    local_3f0 = (expreplay *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_2e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
    operator_delete(local_2e8.m_name._M_dataplus._M_p);
  }
  if (local_3f0 != (expreplay *)0x0) {
    free(local_3f0);
  }
  if (local_398 != local_388) {
    operator_delete(local_398);
  }
  if (local_3d8 != &local_3c8) {
    operator_delete(local_3d8);
  }
  return (base_learner *)__dest_01;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}